

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O2

array<int,_8UL> *
dgrminer::smallerDirectionOfAdjacencyInfo
          (array<int,_8UL> *__return_storage_ptr__,array<int,_8UL> *adjacencyinfo)

{
  int *piVar1;
  int *piVar2;
  int i;
  long lVar3;
  array<int,_8UL> flipped;
  int local_30 [8];
  
  flipAdjacencyInfo(adjacencyinfo);
  lVar3 = 0;
  do {
    if (lVar3 == 8) {
LAB_001192ed:
      local_30[0] = adjacencyinfo->_M_elems[0];
      local_30[1] = adjacencyinfo->_M_elems[1];
      local_30[2] = adjacencyinfo->_M_elems[2];
      local_30[3] = adjacencyinfo->_M_elems[3];
      local_30[4] = adjacencyinfo->_M_elems[4];
      local_30[5] = adjacencyinfo->_M_elems[5];
      local_30[6] = adjacencyinfo->_M_elems[6];
      local_30[7] = adjacencyinfo->_M_elems[7];
      break;
    }
    piVar1 = adjacencyinfo->_M_elems + lVar3;
    piVar2 = local_30 + lVar3;
    if (*piVar1 < *piVar2) goto LAB_001192ed;
    lVar3 = lVar3 + 1;
  } while (*piVar1 <= *piVar2);
  __return_storage_ptr__->_M_elems[4] = local_30[4];
  __return_storage_ptr__->_M_elems[5] = local_30[5];
  __return_storage_ptr__->_M_elems[6] = local_30[6];
  __return_storage_ptr__->_M_elems[7] = local_30[7];
  __return_storage_ptr__->_M_elems[0] = local_30[0];
  __return_storage_ptr__->_M_elems[1] = local_30[1];
  __return_storage_ptr__->_M_elems[2] = local_30[2];
  __return_storage_ptr__->_M_elems[3] = local_30[3];
  return __return_storage_ptr__;
}

Assistant:

std::array<int, 8> smallerDirectionOfAdjacencyInfo(std::array<int, 8> &adjacencyinfo)
    {

        std::array<int, 8> flipped = flipAdjacencyInfo(adjacencyinfo);
        for (int i = 0; i < 8; i++)
        {
            if (adjacencyinfo[i] < flipped[i])
            {
                return adjacencyinfo;
            }
            else if (adjacencyinfo[i] > flipped[i])
            {
                return flipped;
            }
        }
        return adjacencyinfo;
    }